

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
          (SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this,InplaceStr *key,
          VariableData **value)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Node *this_00;
  InplaceStr local_48;
  
  local_48.begin = (char *)0x0;
  local_48.end = (char *)0x0;
  bVar2 = InplaceStr::operator==(key,&local_48);
  if (bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<InplaceStr, VariableData *, InplaceStrHasher, 128>::insert(const Key &, const Value &) [Key = InplaceStr, Value = VariableData *, Hasher = InplaceStrHasher, N = 128]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar4 = this->bucketCount;
  uVar3 = NULLC::GetStringHash(key->begin,key->end);
  if (this->bucketCount != 0) {
    uVar4 = uVar4 - 1;
    uVar3 = uVar3 & uVar4;
    uVar5 = 1;
    do {
      this_00 = this->data + uVar3;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      bVar2 = InplaceStr::operator==(&this_00->key,&local_48);
      if (bVar2) {
        pcVar1 = key->end;
        (this_00->key).begin = key->begin;
        (this_00->key).end = pcVar1;
        this_00->value = *value;
        this->count = this->count + 1;
LAB_001908e9:
        bVar2 = false;
      }
      else {
        bVar2 = InplaceStr::operator==(&this_00->key,key);
        if (bVar2) {
          this_00->value = *value;
          goto LAB_001908e9;
        }
        uVar3 = uVar3 + uVar5 & uVar4;
        bVar2 = true;
      }
      if (!bVar2) {
        return;
      }
      bVar2 = uVar5 < this->bucketCount;
      uVar5 = uVar5 + 1;
    } while (bVar2);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<InplaceStr, VariableData *, InplaceStrHasher, 128>::insert(const Key &, const Value &) [Key = InplaceStr, Value = VariableData *, Hasher = InplaceStrHasher, N = 128]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}